

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O3

int __thiscall dlib::directory::init(directory *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  error *peVar5;
  size_type sVar6;
  stat64 buffer;
  char buf [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10e8;
  stat64 local_10c8;
  char local_1038 [4104];
  
  pcVar4 = realpath(*(char **)ctx,local_1038);
  if (pcVar4 == (char *)0x0) {
    peVar5 = (error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c8,
                   "Unable to find directory ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    error::error(peVar5,(string *)&local_10c8);
    *(undefined ***)peVar5 = &PTR__error_0030fdd0;
    __cxa_throw(peVar5,&dir_not_found::typeinfo,error::~error);
  }
  psVar1 = &(this->state).full_name;
  pcVar4 = (char *)(this->state).full_name._M_string_length;
  strlen(local_1038);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)local_1038);
  pcVar4 = (this->state).full_name._M_dataplus._M_p;
  sVar2 = (this->state).full_name._M_string_length;
  if (sVar2 == 1) {
    if (*pcVar4 == '/') goto LAB_002355f4;
    if (*pcVar4 == '/') {
      sVar6 = 0;
      goto LAB_0023559d;
    }
  }
  else if (pcVar4[sVar2 - 1] == '/') {
    sVar6 = sVar2 - 1;
    if (sVar2 == 0) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 sVar6,0);
    }
LAB_0023559d:
    (this->state).full_name._M_string_length = sVar6;
    pcVar4[sVar2 - 1] = '\0';
  }
  std::__cxx11::string::rfind((char)psVar1,0x2f);
  std::__cxx11::string::substr((ulong)&local_10c8,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)this,(string *)&local_10c8);
  if ((__nlink_t *)local_10c8.st_dev != &local_10c8.st_nlink) {
    operator_delete((void *)local_10c8.st_dev);
  }
  pcVar4 = (psVar1->_M_dataplus)._M_p;
LAB_002355f4:
  iVar3 = stat64(pcVar4,&local_10c8);
  if (iVar3 != 0) {
    peVar5 = (error *)__cxa_allocate_exception(0x30);
    std::operator+(&bStack_10e8,"Unable to find directory ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    error::error(peVar5,&bStack_10e8);
    *(undefined ***)peVar5 = &PTR__error_0030fdd0;
    __cxa_throw(peVar5,&dir_not_found::typeinfo,error::~error);
  }
  if ((local_10c8.st_mode & 0xf000) != 0x4000) {
    peVar5 = (error *)__cxa_allocate_exception(0x30);
    std::operator+(&bStack_10e8,"Unable to find directory ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    error::error(peVar5,&bStack_10e8);
    *(undefined ***)peVar5 = &PTR__error_0030fdd0;
    __cxa_throw(peVar5,&dir_not_found::typeinfo,error::~error);
  }
  return 0x4000;
}

Assistant:

void directory::
    init (
        const std::string& name
    )
    {
        using namespace std;

        
        char buf[PATH_MAX];
        if (realpath(name.c_str(),buf) == 0)
        {
            // the directory was not found
            throw dir_not_found("Unable to find directory " + name);
        }
        state.full_name = buf;
  
        
        const char sep = get_separator();
        if (is_root_path(state.full_name) == false)
        {
            // ensure that thre is not a trialing separator
            if (state.full_name[state.full_name.size()-1] == sep)
                state.full_name.erase(state.full_name.size()-1);

            // pick out the directory name
            string::size_type pos = state.full_name.find_last_of(sep);
            state.name = state.full_name.substr(pos+1);
        }
        else
        {
            // ensure that there is a trailing separator
            if (state.full_name[state.full_name.size()-1] != sep)
                state.full_name += sep;
        }


        struct stat64 buffer;
        // now check that this is actually a valid directory
        if (::stat64(state.full_name.c_str(),&buffer))
        {
            // the directory was not found
            throw dir_not_found("Unable to find directory " + name);
        }
        else if (S_ISDIR(buffer.st_mode) == 0)
        {
            // It is not a directory
            throw dir_not_found("Unable to find directory " + name);
        }
    }